

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O1

dropt_char * dropt_get_error_message(dropt_context *context)

{
  dropt_error error;
  dropt_char *optionArgument;
  dropt_char *pdVar1;
  char *pcVar2;
  
  if (context != (dropt_context *)0x0) {
    error = (context->errorDetails).err;
    if (error == 0) {
      pcVar2 = "";
    }
    else {
      if ((context->errorDetails).message == (dropt_char *)0x0) {
        pdVar1 = (context->errorDetails).optionName;
        optionArgument = (context->errorDetails).optionArgument;
        if (context->errorHandler == (dropt_error_handler_func)0x0) {
          pdVar1 = dropt_default_error_handler(error,pdVar1,optionArgument);
        }
        else {
          pdVar1 = (*context->errorHandler)(error,pdVar1,optionArgument,context->errorHandlerData);
        }
        (context->errorDetails).message = pdVar1;
      }
      pdVar1 = (context->errorDetails).message;
      pcVar2 = "Unknown error";
      if (pdVar1 != (dropt_char *)0x0) {
        pcVar2 = pdVar1;
      }
    }
    return pcVar2;
  }
  dropt_get_error_message_cold_1();
  switch((ulong)context & 0xffffffff) {
  case 0:
    return (dropt_char *)0x0;
  default:
    pcVar2 = "Unknown error handling option %s";
    break;
  case 2:
    pdVar1 = dropt_strdup("Invalid option configuration");
    return pdVar1;
  case 3:
    pdVar1 = dropt_strdup("Insufficient memory");
    return pdVar1;
  case 4:
    pcVar2 = "Invalid option: %s";
    break;
  case 5:
    pcVar2 = "Value required after option %s";
    break;
  case 6:
    pcVar2 = "Invalid value for option %s%s%s";
    goto LAB_001026ba;
  case 7:
    pcVar2 = "Value too large for option %s%s%s";
    goto LAB_001026ba;
  case 8:
    pcVar2 = "Value too small for option %s%s%s";
LAB_001026ba:
    pdVar1 = dropt_asprintf(pcVar2);
    return pdVar1;
  }
  pdVar1 = dropt_asprintf(pcVar2);
  return pdVar1;
}

Assistant:

const dropt_char*
dropt_get_error_message(dropt_context* context)
{
    if (context == NULL)
    {
        DROPT_MISUSE("No dropt context specified.");
        return DROPT_TEXT_LITERAL("");
    }

    if (context->errorDetails.err == dropt_error_none)
    {
        return DROPT_TEXT_LITERAL("");
    }

    if (context->errorDetails.message == NULL)
    {
        if (context->errorHandler != NULL)
        {
            context->errorDetails.message
                = context->errorHandler(context->errorDetails.err,
                                        context->errorDetails.optionName,
                                        context->errorDetails.optionArgument,
                                        context->errorHandlerData);
        }
        else
        {
#ifndef DROPT_NO_STRING_BUFFERS
            context->errorDetails.message
                = dropt_default_error_handler(context->errorDetails.err,
                                              context->errorDetails.optionName,
                                              context->errorDetails.optionArgument);
#endif
        }
    }

    return (context->errorDetails.message == NULL)
           ? DROPT_TEXT_LITERAL("Unknown error")
           : context->errorDetails.message;
}